

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ratio.cpp
# Opt level: O3

void __thiscall
Ratio::addAllFEdges(Ratio *this,vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *edges)

{
  pointer pPVar1;
  PhyloTreeEdge *e;
  pointer pPVar2;
  PhyloTreeEdge *f;
  double dVar3;
  double dVar4;
  
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::reserve
            (&this->fEdges,
             ((long)(edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7 +
             ((long)(this->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
  pPVar1 = (edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pPVar2 = (edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
                super__Vector_impl_data._M_start; pPVar2 != pPVar1; pPVar2 = pPVar2 + 1) {
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::push_back(&this->fEdges,pPVar2);
  }
  pPVar1 = (this->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  dVar3 = 0.0;
  for (pPVar2 = (this->fEdges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                _M_impl.super__Vector_impl_data._M_start; pPVar2 != pPVar1; pPVar2 = pPVar2 + 1) {
    dVar4 = PhyloTreeEdge::getLength(pPVar2);
    dVar3 = dVar3 + dVar4 * dVar4;
  }
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  this->fLength = dVar3;
  return;
}

Assistant:

void Ratio::addAllFEdges(vector<PhyloTreeEdge>& edges) {
    fEdges.reserve(fEdges.size() + edges.size());
    for (auto &f : edges) {
        fEdges.push_back(f);
    }
    fLength = geoAvg(fEdges);
}